

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::processDataConnectionMessage(FederateState *this,ActionMessage *cmd)

{
  string_view subscriberName;
  GlobalHandle sourceToRemove;
  string_view sourceType;
  string_view sourceType_00;
  GlobalHandle newSubscriber;
  Time minTime;
  string_view sourceName;
  string_view sourceName_00;
  string_view sourceName_01;
  GlobalHandle source;
  GlobalHandle subscriberToRemove;
  string_view destType;
  string_view destName;
  GlobalHandle dest;
  string_view stype;
  string_view sourceName_02;
  GlobalHandle newSource;
  string_view sunits;
  FederateStates FVar1;
  bool bVar2;
  action_t aVar3;
  int32_t iVar4;
  GlobalFederateId GVar5;
  GlobalHandle GVar6;
  EndpointInfo *pEVar7;
  InputInfo *pIVar8;
  PublicationInfo *pPVar9;
  ActionMessage *in_RSI;
  long in_RDI;
  PublicationInfo *pubI_1;
  InputInfo *subI_2;
  InputInfo *subI_1;
  EndpointInfo *eptI_1;
  ActionMessage pub;
  PublicationInfo *pubI;
  EndpointInfo *eptI;
  InputInfo *subI;
  FederateState *in_stack_fffffffffffffc98;
  FederateState *this_00;
  ActionMessage *in_stack_fffffffffffffca0;
  ActionMessage *in_stack_fffffffffffffca8;
  GlobalFederateId *this_01;
  SmallBuffer *in_stack_fffffffffffffcb0;
  SmallBuffer *in_stack_fffffffffffffcb8;
  PublicationInfo *in_stack_fffffffffffffcc0;
  Time in_stack_fffffffffffffcc8;
  GlobalFederateId in_stack_fffffffffffffcd0;
  undefined4 uVar10;
  InterfaceHandle in_stack_fffffffffffffcd4;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffcd8;
  GlobalFederateId in_stack_fffffffffffffcdc;
  InterfaceHandle in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  PublicationInfo *in_stack_fffffffffffffce8;
  EndpointInfo *this_02;
  GlobalFederateId in_stack_fffffffffffffcf0;
  InterfaceHandle in_stack_fffffffffffffcf4;
  char *in_stack_fffffffffffffcf8;
  size_t in_stack_fffffffffffffd00;
  ActionMessage *this_03;
  char *in_stack_fffffffffffffd08;
  Time *this_04;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  bool bVar12;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  char *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  GlobalFederateId in_stack_fffffffffffffd6c;
  InterfaceHandle in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  uint16_t local_180;
  Time local_178;
  undefined1 in_stack_fffffffffffffec7;
  FederateState *in_stack_fffffffffffffec8;
  InterfaceHandle in_stack_fffffffffffffed4;
  TimeRepresentation<count_time<9,_long>_> local_e0;
  BaseType local_d4;
  BaseType local_d0;
  BaseType local_cc;
  string_view local_c8;
  GlobalHandle local_b4;
  BaseType local_ac;
  PublicationInfo *local_a8;
  BaseType local_9c;
  __sv_type local_98;
  string_view local_88;
  GlobalHandle local_74;
  BaseType local_6c;
  EndpointInfo *local_68;
  BaseType local_5c;
  __sv_type local_58;
  __sv_type local_48;
  string_view local_38;
  GlobalHandle local_24;
  BaseType local_1c;
  InputInfo *local_18;
  ActionMessage *local_10;
  
  local_10 = in_RSI;
  aVar3 = ActionMessage::action(in_RSI);
  if (aVar3 == cmd_add_publisher) {
    local_1c = (local_10->dest_handle).hid;
    local_18 = InterfaceInfo::getInput
                         ((InterfaceInfo *)in_stack_fffffffffffffcc8.internalTimeCode,
                          in_stack_fffffffffffffcd4);
    if (local_18 == (InputInfo *)0x0) {
      local_6c = (local_10->dest_handle).hid;
      local_68 = InterfaceInfo::getEndpoint
                           ((InterfaceInfo *)in_stack_fffffffffffffcc8.internalTimeCode,
                            in_stack_fffffffffffffcd4);
      if (local_68 != (EndpointInfo *)0x0) {
        local_74 = ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffc98);
        local_88 = ActionMessage::name((ActionMessage *)0x4c9bc9);
        ActionMessage::getString_abi_cxx11_
                  (in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
        local_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffca0);
        GVar5.gid = (BaseType)((ulong)in_stack_fffffffffffffca0 >> 0x20);
        GVar6.handle.hid = in_stack_fffffffffffffcf4.hid;
        GVar6.fed_id.gid = in_stack_fffffffffffffcf0.gid;
        sourceName._M_len._4_4_ = in_stack_fffffffffffffce4;
        sourceName._M_len._0_4_ = in_stack_fffffffffffffce0.hid;
        sourceName._M_str = (char *)in_stack_fffffffffffffce8;
        sourceType._M_len._4_4_ = in_stack_fffffffffffffcd4.hid;
        sourceType._M_len._0_4_ = in_stack_fffffffffffffcd0.gid;
        sourceType._M_str._0_4_ = in_stack_fffffffffffffcd8;
        sourceType._M_str._4_4_ = in_stack_fffffffffffffcdc.gid;
        EndpointInfo::addSource
                  ((EndpointInfo *)in_stack_fffffffffffffcc8.internalTimeCode,GVar6,sourceName,
                   sourceType);
        if (*(char *)(in_RDI + 0x2ff) == '\0') {
          local_9c = (local_10->source_id).gid;
          addDependency(in_stack_fffffffffffffc98,GVar5);
        }
      }
    }
    else {
      local_24 = ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffc98);
      local_38 = ActionMessage::name((ActionMessage *)0x4c9a64);
      ActionMessage::getString_abi_cxx11_
                (in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
      local_48 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffca0);
      ActionMessage::getString_abi_cxx11_
                (in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
      local_58 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffca0);
      newSource.handle.hid = in_stack_fffffffffffffd70.hid;
      newSource.fed_id.gid = in_stack_fffffffffffffd6c.gid;
      sourceName_02._M_str._0_4_ = in_stack_fffffffffffffd60;
      sourceName_02._M_len = in_stack_fffffffffffffd58;
      sourceName_02._M_str._4_4_ = in_stack_fffffffffffffd64;
      stype._M_len._4_4_ = in_stack_fffffffffffffd4c;
      stype._M_len._0_4_ = in_stack_fffffffffffffd48;
      stype._M_str = in_stack_fffffffffffffd50;
      sunits._M_str = in_stack_fffffffffffffd88;
      sunits._M_len = in_stack_fffffffffffffd80;
      this_00 = (FederateState *)local_58._M_len;
      GVar5.gid = local_58._M_str._4_4_;
      bVar2 = InputInfo::addSource
                        ((InputInfo *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                         newSource,sourceName_02,stype,sunits);
      if ((bVar2) && (*(char *)(in_RDI + 0x2ff) == '\0')) {
        local_5c = (local_10->source_id).gid;
        addDependency(this_00,GVar5);
      }
    }
  }
  else if (aVar3 == cmd_add_subscriber) {
    local_ac = (local_10->dest_handle).hid;
    local_a8 = InterfaceInfo::getPublication
                         ((InterfaceInfo *)in_stack_fffffffffffffcc8.internalTimeCode,
                          in_stack_fffffffffffffcd4);
    if (local_a8 != (PublicationInfo *)0x0) {
      local_b4 = ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffc98);
      local_c8 = ActionMessage::name((ActionMessage *)0x4c9ce8);
      newSubscriber.handle.hid = in_stack_fffffffffffffce0.hid;
      newSubscriber.fed_id.gid = in_stack_fffffffffffffcdc.gid;
      subscriberName._M_str._0_4_ = in_stack_fffffffffffffcd0.gid;
      subscriberName._M_len = in_stack_fffffffffffffcc8.internalTimeCode;
      subscriberName._M_str._4_4_ = in_stack_fffffffffffffcd4.hid;
      bVar2 = PublicationInfo::addSubscriber(in_stack_fffffffffffffcc0,newSubscriber,subscriberName)
      ;
      if ((bVar2) && (*(char *)(in_RDI + 0x2ff) == '\0')) {
        local_cc = (local_10->source_id).gid;
        addDependent(in_stack_fffffffffffffc98,
                     (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffca0 >> 0x20));
      }
      FVar1 = getState((FederateState *)0x4c9d69);
      if (FVar1 != CREATED) {
        FVar1 = getState((FederateState *)0x4c9d7e);
        if ((FVar1 == EXECUTING) && (*(char *)(in_RDI + 0x2ff) == '\0')) {
          local_d0 = (local_10->source_id).gid;
          resetDependency(in_stack_fffffffffffffc98,
                          (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffca0 >> 0x20));
          local_d4 = (local_10->source_id).gid;
          addDependent(in_stack_fffffffffffffc98,
                       (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffca0 >> 0x20));
        }
        bVar2 = SmallBuffer::empty(&local_a8->data);
        bVar12 = false;
        if (!bVar2) {
          this_04 = &local_a8->lastPublishTime;
          local_e0 = TimeRepresentation<count_time<9,_long>_>::minVal();
          bVar12 = TimeRepresentation<count_time<9,_long>_>::operator>(this_04,&local_e0);
        }
        if (bVar12 != false) {
          this_03 = (ActionMessage *)&stack0xfffffffffffffe68;
          ActionMessage::ActionMessage
                    ((ActionMessage *)in_stack_fffffffffffffcc0,
                     (action_t)((ulong)in_stack_fffffffffffffcb8 >> 0x20));
          ActionMessage::setSource(this_03,local_a8->id);
          GVar6 = ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffc98);
          ActionMessage::setDestination((ActionMessage *)&stack0xfffffffffffffe68,GVar6);
          iVar4 = getCurrentIteration((FederateState *)0x4c9ec6);
          local_180 = (uint16_t)iVar4;
          SmallBuffer::operator=(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
          local_178.internalTimeCode = (local_a8->lastPublishTime).internalTimeCode;
          routeMessage((FederateState *)
                       CONCAT44(in_stack_fffffffffffffcd4.hid,in_stack_fffffffffffffcd0.gid),
                       (ActionMessage *)in_stack_fffffffffffffcc8.internalTimeCode);
          ActionMessage::~ActionMessage(in_stack_fffffffffffffca0);
        }
      }
    }
  }
  else if (aVar3 == cmd_add_endpoint) {
    pEVar7 = InterfaceInfo::getEndpoint
                       ((InterfaceInfo *)in_stack_fffffffffffffcc8.internalTimeCode,
                        in_stack_fffffffffffffcd4);
    if (pEVar7 != (EndpointInfo *)0x0) {
      bVar2 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                        (local_10,destination_target);
      if (bVar2) {
        this_02 = pEVar7;
        ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffc98);
        ActionMessage::name((ActionMessage *)0x4c9fea);
        ActionMessage::getString_abi_cxx11_
                  (in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffca0);
        GVar5.gid = (BaseType)((ulong)in_stack_fffffffffffffca0 >> 0x20);
        dest.handle.hid._3_1_ = in_stack_fffffffffffffd17;
        dest._0_7_ = in_stack_fffffffffffffd10;
        destName._M_str = in_stack_fffffffffffffd08;
        destName._M_len = in_stack_fffffffffffffd00;
        destType._M_len._4_4_ = in_stack_fffffffffffffcf4.hid;
        destType._M_len._0_4_ = in_stack_fffffffffffffcf0.gid;
        destType._M_str = in_stack_fffffffffffffcf8;
        EndpointInfo::addDestination(this_02,dest,destName,destType);
        if (((pEVar7->targetedEndpoint & 1U) != 0) && (*(char *)(in_RDI + 0x2ff) == '\0')) {
          addDependent(in_stack_fffffffffffffc98,GVar5);
        }
      }
      else {
        uVar10 = SUB84(pEVar7,0);
        uVar11 = (undefined4)((ulong)pEVar7 >> 0x20);
        ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffc98);
        ActionMessage::name((ActionMessage *)0x4ca0d1);
        ActionMessage::getString_abi_cxx11_
                  (in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffca0);
        GVar5.gid = (BaseType)((ulong)in_stack_fffffffffffffca0 >> 0x20);
        source.handle.hid = in_stack_fffffffffffffcf4.hid;
        source.fed_id.gid = in_stack_fffffffffffffcf0.gid;
        sourceName_00._M_len._4_4_ = uVar11;
        sourceName_00._M_len._0_4_ = uVar10;
        sourceName_00._M_str = (char *)in_stack_fffffffffffffce8;
        sourceType_00._M_len._4_4_ = in_stack_fffffffffffffcd4.hid;
        sourceType_00._M_len._0_4_ = in_stack_fffffffffffffcd0.gid;
        sourceType_00._M_str._0_4_ = in_stack_fffffffffffffcd8;
        sourceType_00._M_str._4_4_ = in_stack_fffffffffffffcdc.gid;
        EndpointInfo::addSource
                  ((EndpointInfo *)in_stack_fffffffffffffcc8.internalTimeCode,source,sourceName_00,
                   sourceType_00);
        if (((pEVar7->targetedEndpoint & 1U) != 0) && (*(char *)(in_RDI + 0x2ff) == '\0')) {
          addDependency(in_stack_fffffffffffffc98,GVar5);
          FVar1 = getState((FederateState *)0x4ca18f);
          if (FVar1 == EXECUTING) {
            *(undefined8 *)(in_RDI + 0x518) = *(undefined8 *)(in_RDI + 0x508);
          }
        }
      }
    }
  }
  else if (aVar3 == cmd_remove_named_publication) {
    pIVar8 = InterfaceInfo::getInput
                       ((InterfaceInfo *)in_stack_fffffffffffffcc8.internalTimeCode,
                        in_stack_fffffffffffffcd4);
    if (pIVar8 != (InputInfo *)0x0) {
      uVar10 = SUB84(pIVar8,0);
      uVar11 = (undefined4)((ulong)pIVar8 >> 0x20);
      ActionMessage::name((ActionMessage *)0x4ca211);
      pIVar8 = (InputInfo *)&stack0xfffffffffffffd87;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0.hid),
                 (basic_string_view<char,_std::char_traits<char>_> *)pIVar8,
                 (allocator<char> *)CONCAT44(uVar11,uVar10));
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffca0);
      TimeRepresentation<count_time<9,_long>_>::operator!=
                (&local_10->actionTime,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero
                );
      sourceName_01._M_str._0_4_ = in_stack_fffffffffffffcf0.gid;
      sourceName_01._M_len = (size_t)in_stack_fffffffffffffce8;
      sourceName_01._M_str._4_4_ = in_stack_fffffffffffffcf4.hid;
      minTime.internalTimeCode._4_4_ = in_stack_fffffffffffffce4;
      minTime.internalTimeCode._0_4_ = in_stack_fffffffffffffce0.hid;
      InputInfo::removeSource(pIVar8,sourceName_01,minTime);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffca0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd87);
    }
  }
  else if (aVar3 == cmd_close_interface) {
    this_01 = &local_10->source_id;
    GVar5 = std::atomic<helics::GlobalFederateId>::load
                      ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x2c),seq_cst);
    bVar2 = GlobalFederateId::operator==(this_01,GVar5);
    if (bVar2) {
      closeInterface(in_stack_fffffffffffffec8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec7);
    }
  }
  else if (aVar3 == cmd_remove_subscriber) {
    pPVar9 = InterfaceInfo::getPublication
                       ((InterfaceInfo *)in_stack_fffffffffffffcc8.internalTimeCode,
                        in_stack_fffffffffffffcd4);
    if (pPVar9 != (PublicationInfo *)0x0) {
      ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffc98);
      subscriberToRemove.handle.hid = in_stack_fffffffffffffcf4.hid;
      subscriberToRemove.fed_id.gid = in_stack_fffffffffffffcf0.gid;
      PublicationInfo::removeSubscriber(in_stack_fffffffffffffce8,subscriberToRemove);
    }
  }
  else if ((aVar3 == cmd_remove_publication) &&
          (pIVar8 = InterfaceInfo::getInput
                              ((InterfaceInfo *)in_stack_fffffffffffffcc8.internalTimeCode,
                               in_stack_fffffffffffffcd4), pIVar8 != (InputInfo *)0x0)) {
    ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffc98);
    TimeRepresentation<count_time<9,_long>_>::operator!=
              (&local_10->actionTime,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    sourceToRemove.handle.hid = in_stack_fffffffffffffcd4.hid;
    sourceToRemove.fed_id.gid = in_stack_fffffffffffffcd0.gid;
    InputInfo::removeSource(pIVar8,sourceToRemove,in_stack_fffffffffffffcc8);
  }
  return;
}

Assistant:

void FederateState::processDataConnectionMessage(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_ADD_PUBLISHER: {
            auto* subI = interfaceInformation.getInput(cmd.dest_handle);
            if (subI != nullptr) {
                if (subI->addSource(cmd.getSource(),
                                    cmd.name(),
                                    cmd.getString(typeStringLoc),
                                    cmd.getString(unitStringLoc))) {
                    if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                        addDependency(cmd.source_id);
                    }
                }
            } else {
                auto* eptI = interfaceInformation.getEndpoint(cmd.dest_handle);
                if (eptI != nullptr) {
                    eptI->addSource(cmd.getSource(), cmd.name(), cmd.getString(typeStringLoc));
                    if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                        addDependency(cmd.source_id);
                    }
                }
            }
        } break;
        case CMD_ADD_SUBSCRIBER: {
            auto* pubI = interfaceInformation.getPublication(cmd.dest_handle);
            if (pubI != nullptr) {
                if (pubI->addSubscriber(cmd.getSource(), cmd.name())) {
                    if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                        addDependent(cmd.source_id);
                    }
                }

                if (getState() > FederateStates::CREATED) {
                    if (getState() == FederateStates::EXECUTING &&
                        timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                        resetDependency(cmd.source_id);
                        addDependent(cmd.source_id);
                    }
                    if (!pubI->data.empty() && pubI->lastPublishTime > Time::minVal()) {
                        ActionMessage pub(CMD_PUB);
                        pub.setSource(pubI->id);
                        pub.setDestination(cmd.getSource());
                        pub.counter = static_cast<uint16_t>(getCurrentIteration());
                        pub.payload = pubI->data;
                        pub.actionTime = pubI->lastPublishTime;
                        routeMessage(std::move(pub));
                    }
                }
            }
        } break;
        case CMD_ADD_ENDPOINT: {
            auto* eptI = interfaceInformation.getEndpoint(cmd.dest_handle);
            if (eptI != nullptr) {
                if (checkActionFlag(cmd, destination_target)) {
                    eptI->addDestination(cmd.getSource(), cmd.name(), cmd.getString(typeStringLoc));
                    if (eptI->targetedEndpoint) {
                        if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                            addDependent(cmd.source_id);
                        }
                    }
                } else {
                    eptI->addSource(cmd.getSource(), cmd.name(), cmd.getString(typeStringLoc));
                    if (eptI->targetedEndpoint) {
                        if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                            addDependency(cmd.source_id);
                            if (getState() == FederateStates::EXECUTING) {
                                minimumReceiveTime = time_granted;
                            }
                        }
                    }
                }
            }
        } break;
        case CMD_REMOVE_NAMED_PUBLICATION: {
            auto* subI = interfaceInformation.getInput(cmd.source_handle);
            if (subI != nullptr) {
                subI->removeSource(std::string(cmd.name()),
                                   (cmd.actionTime != timeZero) ? cmd.actionTime : time_granted);
            }
            break;
        }
        case CMD_REMOVE_PUBLICATION: {
            auto* subI = interfaceInformation.getInput(cmd.dest_handle);
            if (subI != nullptr) {
                subI->removeSource(cmd.getSource(),
                                   (cmd.actionTime != timeZero) ? cmd.actionTime : time_granted);
            }
            break;
        }
        case CMD_REMOVE_SUBSCRIBER: {
            auto* pubI = interfaceInformation.getPublication(cmd.dest_handle);
            if (pubI != nullptr) {
                pubI->removeSubscriber(cmd.getSource());
            }
        } break;
        case CMD_CLOSE_INTERFACE:
            if (cmd.source_id == global_id.load()) {
                closeInterface(cmd.source_handle, static_cast<InterfaceType>(cmd.counter));
            }
            break;

        case CMD_REMOVE_ENDPOINT:
        default:
            break;
    }
}